

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_4.cpp
# Opt level: O3

int main(void)

{
  char *__s;
  size_t sVar1;
  
  __s = (char *)operator_new__(0xe);
  memcpy(__s,"HELLO, WORLD!",0xd);
  __s[0xd] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HELLO, WORLD!",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," == ",4);
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  operator_delete__(__s);
  return 0;
}

Assistant:

char* strdup(const char* s)
{
	size_t length = strlen(s);
	char* ss = new char[length + 1];
	for (size_t i = 0; i < length; ++i)
		ss[i] = s[i];
	ss[length] = '\0';
	return ss;
}